

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

void free_link_endpoint(LINK_ENDPOINT_HANDLE link_endpoint)

{
  if (link_endpoint->on_link_endpoint_destroyed_callback != (ON_LINK_ENDPOINT_DESTROYED_CALLBACK)0x0
     ) {
    (*link_endpoint->on_link_endpoint_destroyed_callback)
              (link_endpoint,link_endpoint->on_link_endpoint_destroyed_context);
  }
  if (link_endpoint->name != (char *)0x0) {
    free(link_endpoint->name);
  }
  free(link_endpoint);
  return;
}

Assistant:

static void free_link_endpoint(LINK_ENDPOINT_HANDLE link_endpoint)
{
    // The link endpoint handle can be managed by both uamqp and the upper layer.
    // uamqp may destroy a link endpoint if a DETACH is received from the remote endpoint,
    // so in this case the upper layer must be notified so it does not attempt to destroy the link endpoint as well.
    // Ref counting would not suffice to address this situation as uamqp does not destroy link endpoints by itself 
    // every time, only when receiving a DETACH.
    if (link_endpoint->on_link_endpoint_destroyed_callback != NULL)
    {
        link_endpoint->on_link_endpoint_destroyed_callback(link_endpoint, link_endpoint->on_link_endpoint_destroyed_context);
    }

    if (link_endpoint->name != NULL)
    {
        free(link_endpoint->name);
    }

    free(link_endpoint);
}